

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O3

int vm_run_image(vm_run_image_params *params)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TadsNetConfig *pTVar3;
  err_frame_t *peVar4;
  CVmException *pCVar5;
  CVmFile *this;
  FILE *__stream;
  long base_ofs;
  char *pcVar6;
  err_id_t eVar7;
  long *in_FS_OFFSET;
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  vm_globals *vmg__;
  err_frame_t err_cur__;
  undefined1 local_2058 [16];
  char *local_2048;
  char *pcStack_2040;
  char abuf [4096];
  char path [4096];
  
  loader = (CVmImageLoader *)0x0;
  imagefp = (CVmImageFile *)0x0;
  os_get_abs_filename(G_os_gamename,0x1000,params->image_file_name);
  this = (CVmFile *)operator_new(0x10);
  this->fp_ = (osfildef *)0x0;
  this->seek_base_ = 0;
  uVar1 = params->clientifc;
  uVar2 = params->hostifc;
  local_2058._8_4_ = (int)uVar1;
  local_2058._0_8_ = uVar2;
  local_2058._12_4_ = (int)((ulong)uVar1 >> 0x20);
  local_2048 = params->charset;
  pcStack_2040 = params->log_charset;
  vm_initialize(&vmg__,(vm_init_options *)local_2058);
  G_err_frame::__tls_init();
  err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    if (params->res_dir != (char *)0x0) {
      (*params->hostifc->_vptr_CVmHostIfc[9])();
    }
    if (params->file_dir != (char *)0x0) {
      os_get_abs_filename(abuf,0x1000,params->file_dir);
      G_file_path_X = lib_copy_str(abuf);
    }
    if (params->sandbox_dir == (char *)0x0) {
      os_get_path_name(path,0x1000,params->image_file_name);
      os_get_abs_filename(abuf,0x1000,path);
    }
    else {
      os_get_abs_filename(abuf,0x1000,params->sandbox_dir);
    }
    G_sandbox_path_X = lib_copy_str(abuf);
    G_net_config_X = params->netconfig;
    if (params->timezone != (char *)0x0) {
      CVmTimeZoneCache::set_local_zone(G_tzcache_X,params->timezone);
    }
    pcVar6 = "T3 VM 3.1.3 - Copyright 1999, 2012 Michael J. Roberts";
    if (params->show_banner == 0) {
      pcVar6 = (char *)0x0;
    }
    (*params->clientifc->_vptr_CVmMainClientIfc[5])
              (params->clientifc,0,params->script_file,(ulong)(uint)params->script_quiet,
               params->log_file,params->cmd_log_file,pcVar6,(ulong)(uint)params->more_mode);
    if (params->load_from_exe == 0) {
      CVmFile::open_read(this,G_os_gamename,0xc);
      base_ofs = 0;
    }
    else {
      __stream = (FILE *)os_exeseek(G_os_gamename,"TGAM");
      if (__stream == (FILE *)0x0) {
        err_throw(0x145);
      }
      base_ofs = ftell(__stream);
      this->fp_ = (osfildef *)__stream;
      this->seek_base_ = base_ofs;
    }
    imagefp = (CVmImageFile *)operator_new(0x20);
    imagefp->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_003663f8;
    imagefp[1]._vptr_CVmImageFile = (_func_int **)this;
    imagefp[2]._vptr_CVmImageFile = (_func_int **)0x0;
    imagefp[3]._vptr_CVmImageFile = (_func_int **)0x0;
    loader = (CVmImageLoader *)operator_new(0x98);
    CVmImageLoader::CVmImageLoader(loader,imagefp,G_os_gamename,base_ofs);
    CVmImageLoader::load(loader);
    (*params->clientifc->_vptr_CVmMainClientIfc[7])(params->clientifc,0);
    if (params->seed_rand != 0) {
      CVmBifTADS::randomize(0);
    }
    if ((params->netconfig != (TadsNetConfig *)0x0) &&
       (pcVar6 = vm_get_ifid(params->hostifc), pcVar6 != (char *)0x0)) {
      TadsNetConfig::set(params->netconfig,"ifid",pcVar6);
      free(pcVar6);
    }
    CVmImageLoader::run(loader,params->prog_argv,params->prog_argc,(CVmRuntimeSymbols *)0x0,
                        (CVmRuntimeSymbols *)0x0,params->saved_state);
    (*params->clientifc->_vptr_CVmMainClientIfc[8])(params->clientifc,0);
  }
  pCVar5 = err_cur__.exc_;
  eVar7 = 0;
  if ((err_cur__.state_ == 1) &&
     (err_cur__.state_ = 2, eVar7 = 0, (err_cur__.exc_)->error_code_ != 0x95a)) {
    (*params->clientifc->_vptr_CVmMainClientIfc[9])(params->clientifc,0);
    eVar7 = pCVar5->error_code_;
    CVmRun::get_exc_message(pCVar5,abuf,0x200,1);
    (*params->clientifc->_vptr_CVmMainClientIfc[10])(params->clientifc,0,pCVar5,abuf,0);
  }
  peVar4 = err_cur__.prv_;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)peVar4;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pCVar5 = err_cur__.exc_;
    G_err_frame::__tls_init();
    *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar5;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  lib_free_str(G_file_path_X);
  lib_free_str(G_sandbox_path_X);
  if (loader != (CVmImageLoader *)0x0) {
    CVmImageLoader::unload(loader);
    if (loader != (CVmImageLoader *)0x0) {
      CVmImageLoader::~CVmImageLoader(loader);
    }
    operator_delete(loader,0x98);
  }
  if ((imagefp != (CVmImageFile *)0x0) && (imagefp != (CVmImageFile *)0x0)) {
    (*imagefp->_vptr_CVmImageFile[1])();
  }
  (*params->clientifc->_vptr_CVmMainClientIfc[6])(params->clientifc,0);
  pTVar3 = G_net_config_X;
  if (G_net_config_X != (TadsNetConfig *)0x0) {
    TadsNetConfig::~TadsNetConfig(G_net_config_X);
    operator_delete(pTVar3,0x10);
  }
  vm_terminate(vmg__,params->clientifc);
  CVmFile::~CVmFile(this);
  operator_delete(this,0x10);
  return eVar7;
}

Assistant:

int vm_run_image(const vm_run_image_params *params)
{
    CVmFile *fp = 0;
    CVmImageLoader *volatile loader = 0;
    CVmImageFile *volatile imagefp = 0;
    unsigned long image_file_base = 0;
    int retval;
    vm_globals *vmg__;

    /* 
     *   get the full absolute path for the image file, to ensure that future
     *   references are independent of working directory changes 
     */
    os_get_abs_filename(G_os_gamename, sizeof(G_os_gamename),
                        params->image_file_name);

    /* presume we will return success */
    retval = 0;

    /* make sure the local time zone settings are initialized */
    os_tzset();

    /* create the file object */
    fp = new CVmFile();

    /* initialize the VM */
    vm_init_options opts(params->hostifc, params->clientifc,
                         params->charset, params->log_charset);
    vm_initialize(&vmg__, &opts);

    /* catch any errors that occur during loading and running */
    err_try
    {
        /* if we have a resource root path, tell the host interface */
        if (params->res_dir != 0)
            params->hostifc->set_res_dir(params->res_dir);
        
        /* 
         *   Save the default working directory for file operations, if
         *   specified.  If it's not specified, use the image file directory
         *   as the default. 
         */
        if (params->file_dir != 0)
            G_file_path = path_param_to_abs(params->file_dir);
        
        /* set the sandbox directory (for file safety restrictions) */
        if (params->sandbox_dir != 0)
            G_sandbox_path = path_param_to_abs(params->sandbox_dir);
        else
            G_sandbox_path = file_param_to_abs_path(params->image_file_name);
        
        /* set the networking configuration in the globals */
        G_net_config = params->netconfig;

        /* set the local time zone, if specified */
        if (params->timezone)
            G_tzcache->set_local_zone(params->timezone);
        
        /* tell the client system to initialize */
        params->clientifc->client_init(
            VMGLOB_ADDR,
            params->script_file, params->script_quiet,
            params->log_file, params->cmd_log_file,
            params->show_banner ? T3VM_BANNER_STRING : 0,
            params->more_mode);
        
        /* open the byte-code file */
        if (params->load_from_exe)
        {
            /* find the image within the executable */
            osfildef *exe_fp = os_exeseek(G_os_gamename, "TGAM");
            if (exe_fp == 0)
                err_throw(VMERR_NO_IMAGE_IN_EXE);

            /* 
             *   set up to read from the executable at the location of the
             *   embedded image file that we just found 
             */
            image_file_base = osfpos(exe_fp);
            fp->set_file(exe_fp, image_file_base);
        }
        else
        {
            /* reading from a normal file - open the file */
            fp->open_read(G_os_gamename, OSFTT3IMG);
        }

        /* create the loader */
        imagefp = new CVmImageFileExt(fp);
        loader = new CVmImageLoader(imagefp, G_os_gamename, image_file_base);

        /* load the image */
        loader->load(vmg0_);

        /* let the client prepare for execution */
        params->clientifc->pre_exec(VMGLOB_ADDR);

        /* if desired, seed the random number generator */
        if (params->seed_rand)
            CVmBifTADS::randomize(vmg_ 0);

#ifdef TADSNET
        /* 
         *   if we have a network configuration, get the game's IFID - this
         *   is needed to identify the game to the storage server 
         */
        if (params->netconfig != 0)
        {
            char *ifid = vm_get_ifid(params->hostifc);
            if (ifid != 0)
            {
                params->netconfig->set("ifid", ifid);
                t3free(ifid);
            }
        }
#endif /* TADSNET */

        /* run the program from the main entrypoint */
        loader->run(vmg_ params->prog_argv, params->prog_argc,
                    0, 0, params->saved_state);

        /* tell the client we're done with execution */
        params->clientifc->post_exec(VMGLOB_ADDR);
    }